

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSym.c
# Opt level: O3

int Sim_ComputeTwoVarSymms(Abc_Ntk_t *pNtk,int fVerbose)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Sym_Man_t *p;
  long lVar6;
  long lVar7;
  ushort uVar8;
  ulong uVar9;
  timespec ts;
  timespec local_48;
  long local_38;
  
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    local_38 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    local_38 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  srand(0xabc);
  p = Sym_ManStart(pNtk,fVerbose);
  uVar4 = Sim_UtilCountAllPairs(p->vSuppFun,p->nSimWords,p->vPairsTotal);
  p->nPairsRem = uVar4;
  p->nPairsTotal = uVar4;
  if (fVerbose != 0) {
    printf("Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n",(ulong)uVar4,
           (ulong)(uint)p->nPairsSymm,(ulong)(uint)p->nPairsNonSymm,(ulong)uVar4);
  }
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  Sim_SymmsStructCompute(pNtk,p->vMatrSymms,p->vSuppFun);
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p->timeStruct = lVar7 + lVar6;
  Sim_UtilCountPairsAll(p);
  p->nPairsSymmStr = p->nPairsSymm;
  if (fVerbose != 0) {
    printf("Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n",(ulong)(uint)p->nPairsTotal
           ,(ulong)(uint)p->nPairsSymm,(ulong)(uint)p->nPairsNonSymm,(ulong)(uint)p->nPairsRem);
  }
  uVar8 = 1;
  iVar3 = 0;
  do {
    Sim_UtilSetRandom(p->uPatRand,p->nSimWords);
    Sim_SymmsSimulate(p,p->uPatRand,p->vMatrNonSymms);
    if ((ushort)((uVar8 / 0x32) * -0x32 + 1) == (short)iVar3) {
      iVar5 = Sim_UtilMatrsAreDisjoint(p);
      if (iVar5 == 0) {
        __assert_fail("Sim_UtilMatrsAreDisjoint( p )",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sim/simSym.c"
                      ,0x53,"int Sim_ComputeTwoVarSymms(Abc_Ntk_t *, int)");
      }
      Sim_UtilCountPairsAll(p);
      if ((fVerbose != 0) && ((ushort)((uVar8 / 500) * -500 + 1) == (short)iVar3)) {
        printf("Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n",
               (ulong)(uint)p->nPairsTotal,(ulong)(uint)p->nPairsSymm,(ulong)(uint)p->nPairsNonSymm,
               (ulong)(uint)p->nPairsRem);
      }
    }
    iVar3 = iVar3 + -1;
    uVar8 = uVar8 + 1;
  } while (iVar3 != -1000);
  iVar3 = Sim_SymmsGetPatternUsingSat(p,p->uPatRand);
  if (iVar3 != 0) {
    uVar9 = 1;
    iVar3 = -1;
    do {
      Sim_SymmsSimulate(p,p->uPatRand,p->vMatrNonSymms);
      puVar2 = p->uPatRand;
      puVar1 = puVar2 + (p->iVar1 >> 5);
      *puVar1 = *puVar1 ^ 1 << ((byte)p->iVar1 & 0x1f);
      Sim_SymmsSimulate(p,puVar2,p->vMatrNonSymms);
      puVar2 = p->uPatRand;
      puVar1 = puVar2 + (p->iVar2 >> 5);
      *puVar1 = *puVar1 ^ 1 << ((byte)p->iVar2 & 0x1f);
      Sim_SymmsSimulate(p,puVar2,p->vMatrNonSymms);
      puVar2 = p->uPatRand;
      puVar1 = puVar2 + (p->iVar1 >> 5);
      *puVar1 = *puVar1 ^ 1 << ((byte)p->iVar1 & 0x1f);
      Sim_SymmsSimulate(p,puVar2,p->vMatrNonSymms);
      p->uPatRand[p->iVar2 >> 5] = p->uPatRand[p->iVar2 >> 5] ^ 1 << ((byte)p->iVar2 & 0x1f);
      if ((int)(uVar9 / 10) * 10 + iVar3 == 0) {
        iVar5 = Sim_UtilMatrsAreDisjoint(p);
        if (iVar5 == 0) {
          __assert_fail("Sim_UtilMatrsAreDisjoint( p )",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sim/simSym.c"
                        ,0x75,"int Sim_ComputeTwoVarSymms(Abc_Ntk_t *, int)");
        }
        Sim_UtilCountPairsAll(p);
        if ((fVerbose != 0) && ((int)(uVar9 / 0x32) * 0x32 + iVar3 == 0)) {
          printf("Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n",
                 (ulong)(uint)p->nPairsTotal,(ulong)(uint)p->nPairsSymm,
                 (ulong)(uint)p->nPairsNonSymm,(ulong)(uint)p->nPairsRem);
        }
      }
      uVar9 = (ulong)((int)uVar9 + 1);
      iVar5 = Sim_SymmsGetPatternUsingSat(p,p->uPatRand);
      iVar3 = iVar3 + -1;
    } while (iVar5 != 0);
  }
  Sim_UtilCountPairsAll(p);
  if (fVerbose != 0) {
    printf("Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n",(ulong)(uint)p->nPairsTotal
           ,(ulong)(uint)p->nPairsSymm,(ulong)(uint)p->nPairsNonSymm,(ulong)(uint)p->nPairsRem);
  }
  iVar3 = p->nPairsSymm;
  iVar5 = clock_gettime(3,&local_48);
  if (iVar5 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p->timeTotal = lVar6 + local_38;
  Sym_ManStop(p);
  return iVar3;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////
 
////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes two variable symmetries.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Sim_ComputeTwoVarSymms( Abc_Ntk_t * pNtk, int fVerbose )
{
    Sym_Man_t * p;
    Vec_Ptr_t * vResult;
    int Result;
    int i;
    abctime clk, clkTotal = Abc_Clock();

    srand( 0xABC );

    // start the simulation manager
    p = Sym_ManStart( pNtk, fVerbose );
    p->nPairsTotal = p->nPairsRem = Sim_UtilCountAllPairs( p->vSuppFun, p->nSimWords, p->vPairsTotal );
    if ( fVerbose )
        printf( "Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n", 
               p->nPairsTotal, p->nPairsSymm, p->nPairsNonSymm, p->nPairsRem );

    // detect symmetries using circuit structure
clk = Abc_Clock();
    Sim_SymmsStructCompute( pNtk, p->vMatrSymms, p->vSuppFun );
p->timeStruct = Abc_Clock() - clk;

    Sim_UtilCountPairsAll( p );
    p->nPairsSymmStr = p->nPairsSymm;
    if ( fVerbose )
        printf( "Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n", 
            p->nPairsTotal, p->nPairsSymm, p->nPairsNonSymm, p->nPairsRem );

    // detect symmetries using simulation
    for ( i = 1; i <= 1000; i++ )
    {
        // simulate this pattern
        Sim_UtilSetRandom( p->uPatRand, p->nSimWords );
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
        if ( i % 50 != 0 )
            continue;
        // check disjointness
        assert( Sim_UtilMatrsAreDisjoint( p ) );
        // count the number of pairs
        Sim_UtilCountPairsAll( p );
        if ( i % 500 != 0 )
            continue;
        if ( fVerbose )
            printf( "Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n", 
                p->nPairsTotal, p->nPairsSymm, p->nPairsNonSymm, p->nPairsRem );
    }

    // detect symmetries using SAT
    for ( i = 1; Sim_SymmsGetPatternUsingSat( p, p->uPatRand ); i++ )
    {
        // simulate this pattern in four polarities
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
        Sim_XorBit( p->uPatRand, p->iVar1 );
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
        Sim_XorBit( p->uPatRand, p->iVar2 );
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
        Sim_XorBit( p->uPatRand, p->iVar1 );
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
        Sim_XorBit( p->uPatRand, p->iVar2 );
/*
        // try the previuos pair
        Sim_XorBit( p->uPatRand, p->iVar1Old );
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
        Sim_XorBit( p->uPatRand, p->iVar2Old );
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
        Sim_XorBit( p->uPatRand, p->iVar1Old );
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
*/
        if ( i % 10 != 0 )
            continue;
        // check disjointness
        assert( Sim_UtilMatrsAreDisjoint( p ) );
        // count the number of pairs
        Sim_UtilCountPairsAll( p );
        if ( i % 50 != 0 )
            continue;
        if ( fVerbose )
            printf( "Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n", 
                p->nPairsTotal, p->nPairsSymm, p->nPairsNonSymm, p->nPairsRem );
    }

    // count the number of pairs
    Sim_UtilCountPairsAll( p );
    if ( fVerbose )
        printf( "Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n", 
            p->nPairsTotal, p->nPairsSymm, p->nPairsNonSymm, p->nPairsRem );
//    Sim_UtilCountPairsAllPrint( p );

    Result = p->nPairsSymm;
    vResult = p->vMatrSymms;  
p->timeTotal = Abc_Clock() - clkTotal;
    //  p->vMatrSymms = NULL;
    Sym_ManStop( p );
    return Result;
}